

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
findPosition(HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
             *this,KeyType *key,u8 *meta,u64 *startPos,u64 *maxPos,u64 *pos)

{
  undefined8 uVar1;
  byte bVar2;
  _Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
  _Var3;
  uchar *puVar4;
  u64 uVar5;
  ulong uVar6;
  int unaff_EBP;
  ulong uVar7;
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  
  uVar7 = (ulong)*key & 0xffffffff;
  uVar6 = (ulong)*key >> 0x20;
  uVar6 = (uVar6 + 0x80c8963be3e4c2f3) * (uVar7 + 0xc8497d2a400d9551) >> 0x20 ^
          (uVar6 + 0x8a183895eeac1536) * (uVar7 + 0x42d8680e260ae5b);
  uVar7 = uVar6 >> ((byte)this->numHashShift & 0x3f);
  *startPos = uVar7;
  *maxPos = uVar7 + 0x7f & this->tableSizeMask;
  *meta = (byte)(uVar6 >> ((byte)this->numHashShift & 0x3f)) | 0x80;
  _Var3._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
       .
       super__Head_base<0UL,_HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>_*,_false>
       ._M_head_impl;
  *pos = *startPos;
  puVar4 = (this->metadata)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  do {
    uVar5 = *pos;
    bVar2 = puVar4[uVar5];
    if (-1 < (char)bVar2) {
      return false;
    }
    if ((bVar2 == *meta) &&
       (uVar1 = _Var3._M_head_impl[uVar5].key_, iVar9 = -(uint)(SUB84(uVar1,0) == (*key).first),
       iVar10 = -(uint)(SUB84((ulong)uVar1 >> 0x20,0) == (*key).second), auVar8._4_4_ = iVar9,
       auVar8._0_4_ = iVar9, auVar8._8_4_ = iVar10, auVar8._12_4_ = iVar10,
       unaff_EBP = movmskpd(unaff_EBP,auVar8), unaff_EBP == 3)) {
      return true;
    }
    if ((ulong)((int)uVar5 - (uint)bVar2 & 0x7f) < (uVar5 - *startPos & this->tableSizeMask)) {
      return false;
    }
    uVar6 = this->tableSizeMask & uVar5 + 1;
    *pos = uVar6;
  } while (uVar6 != *maxPos);
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }